

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

PathDeclarationSyntax * __thiscall slang::parsing::Parser::parsePathDeclaration(Parser *this)

{
  Info *pIVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar7;
  SourceLocation SVar8;
  SourceLocation SVar9;
  pointer pTVar10;
  ExpressionSyntax *pEVar11;
  EdgeSensitivePathSuffixSyntax *suffix;
  long lVar12;
  undefined4 extraout_var_00;
  PathDeclarationSyntax *pPVar13;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar14;
  __extent_storage<18446744073709551615UL> _Var15;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *extraout_RDX_01;
  Info *extraout_RDX_02;
  Info *extraout_RDX_03;
  Info *extraout_RDX_04;
  Info *extraout_RDX_05;
  Info *extraout_RDX_06;
  Info *pIVar16;
  Info *extraout_RDX_07;
  ulong extraout_RDX_08;
  Info *extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong uVar17;
  TokenKind kind;
  variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *__v;
  TokenKind TVar18;
  Info *this_00;
  Token edgeIdentifier;
  Token equals;
  Token TVar19;
  Token TVar20;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> sVar21;
  Token TVar22;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar23;
  string_view sVar24;
  SourceRange SVar25;
  Token openParen;
  Token openParen_00;
  SourceRange range;
  Token polarityOperator;
  Token valueCloseParen;
  Token valueOpenParen;
  Token first;
  Token local_2d0;
  Info *local_2c0;
  Token local_2b8;
  Info *local_2a8;
  __extent_storage<18446744073709551615UL> local_2a0;
  Token local_298;
  pointer local_288;
  undefined8 local_280;
  Token local_278;
  Token local_268;
  pointer local_258;
  Token local_250;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_240;
  ulong local_230;
  undefined8 uStack_228;
  ulong local_220;
  long local_218;
  ulong local_210;
  Info *local_208;
  undefined8 local_200;
  pointer local_1f8;
  Info *local_1f0;
  Token local_1e8;
  Token local_1d8;
  undefined1 local_1c8 [16];
  SyntaxNode *local_1b8;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> _Stack_1b0;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> sStack_1a0;
  undefined4 extraout_var;
  
  TVar19 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  TVar20 = parseEdgeKeyword(this);
  sVar21 = parsePathTerminals(this);
  local_2a0 = sVar21._M_extent._M_extent_value;
  local_288 = sVar21._M_ptr;
  TVar22 = ParserBase::peek(&this->super_ParserBase);
  if ((TVar22.kind == Minus) || (TVar22.kind == Plus)) {
    local_1c8 = (undefined1  [16])ParserBase::consume(&this->super_ParserBase);
  }
  else {
    Token::Token((Token *)local_1c8);
  }
  local_278.kind = local_1c8._0_2_;
  local_278._2_1_ = local_1c8[2];
  local_278.numFlags.raw = local_1c8[3];
  local_278.rawLen = local_1c8._4_4_;
  local_278.info = (Info *)local_1c8._8_8_;
  Token::Token(&local_2b8);
  local_280 = TVar20._0_8_;
  if (local_278.info == (Info *)0x0) {
    local_2c0 = TVar19.info;
    local_2a8 = (Info *)TVar19._0_8_;
    bVar5 = ParserBase::peek(&this->super_ParserBase,PlusEqual);
    if (!bVar5) {
      bVar5 = ParserBase::peek(&this->super_ParserBase,MinusEqual);
      TVar19.info = local_2c0;
      TVar19._0_8_ = local_2a8;
      if (!bVar5) goto LAB_00444e03;
    }
    local_278 = ParserBase::consume(&this->super_ParserBase);
    local_2b8 = ParserBase::consumeIf(&this->super_ParserBase,GreaterThan);
    if (local_2b8.info == (Info *)0x0) {
      SVar8 = Token::location(&local_278);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x4b0005,
                          (SourceLocation)
                          ((long)SVar8 * 0x10 + 0x100000000 >> 4 & 0xfffffffff0000000U |
                          (ulong)(SVar8._0_4_ & 0xfffffff)));
      local_1c8 = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
      SVar8 = Token::location((Token *)local_1c8);
      kind = GreaterThan;
LAB_00444fb2:
      local_2b8 = ParserBase::missingToken(&this->super_ParserBase,kind,SVar8);
    }
    else {
      sVar23 = Token::trivia(&local_2b8);
      if (sVar23._M_extent._M_extent_value._M_extent_value != 0) {
        SVar8 = Token::location(&local_278);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x4b0005,
                            (SourceLocation)
                            ((long)SVar8 * 0x10 + 0x100000000 >> 4 & 0xfffffffff0000000U |
                            (ulong)(SVar8._0_4_ & 0xfffffff)));
      }
    }
LAB_00444fc4:
    bVar5 = false;
  }
  else {
LAB_00444e03:
    local_2c0 = TVar19.info;
    local_2a8 = TVar19._0_8_;
    TVar19 = ParserBase::peek(&this->super_ParserBase);
    if (TVar19.kind == EqualsArrow) {
      local_2b8 = ParserBase::consume(&this->super_ParserBase);
      goto LAB_00444fc4;
    }
    if (TVar19.kind != StarArrow) {
      local_1c8 = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
      SVar8 = Token::location((Token *)local_1c8);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x4b0005,SVar8);
      local_1c8 = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
      SVar8 = Token::location((Token *)local_1c8);
      kind = EqualsArrow;
      goto LAB_00444fb2;
    }
    local_2b8 = ParserBase::consume(&this->super_ParserBase);
    bVar5 = true;
  }
  pTVar10 = local_288;
  if (2 < local_2a0._M_extent_value && !bVar5) {
    ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                         (local_288 + 2));
    local_1c8 = (undefined1  [16])slang::syntax::SyntaxNode::getFirstToken(*ppSVar7);
    ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                         (pTVar10 + (local_2a0._M_extent_value - 1)));
    local_240._M_first._M_storage =
         (_Uninitialized<slang::parsing::Token,_true>)
         slang::syntax::SyntaxNode::getLastToken(*ppSVar7);
    SVar8 = Token::location((Token *)local_1c8);
    SVar9 = Token::location(&local_240._M_first._M_storage);
    sVar24 = Token::rawText(&local_240._M_first._M_storage);
    SVar25.endLoc = (SourceLocation)((long)SVar9 + sVar24._M_len * 0x10000000);
    SVar25.startLoc = SVar8;
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x820005,SVar25);
  }
  bVar4 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
  local_1f0 = TVar20.info;
  if (bVar4) {
    TVar19 = ParserBase::consume(&this->super_ParserBase);
    local_208 = TVar19.info;
    local_200 = TVar19._0_8_;
    sVar21 = parsePathTerminals(this);
    _Var15 = sVar21._M_extent._M_extent_value;
    TVar19 = ParserBase::peek(&this->super_ParserBase);
    local_1f8 = sVar21._M_ptr;
    if ((TVar19.kind == Minus) || (TVar19.kind == Plus)) {
      local_1c8 = (undefined1  [16])ParserBase::consume(&this->super_ParserBase);
    }
    else {
      Token::Token((Token *)local_1c8);
    }
    uVar2 = local_1c8._0_8_;
    uVar3 = local_1c8._8_8_;
    Token::Token(&local_2d0);
    if (((Info *)uVar3 == (Info *)0x0) &&
       ((bVar4 = ParserBase::peek(&this->super_ParserBase,PlusColon), bVar4 ||
        (bVar4 = ParserBase::peek(&this->super_ParserBase,MinusColon), bVar4)))) {
      TVar20 = ParserBase::consume(&this->super_ParserBase);
    }
    else {
      local_258 = (pointer)uVar2;
      local_2d0 = ParserBase::expect(&this->super_ParserBase,Colon);
      TVar20.info = (Info *)uVar3;
      TVar20._0_8_ = local_258;
    }
    local_258 = TVar20._0_8_;
    pEVar11 = parseExpression(this);
    local_1d8 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    pTVar10 = local_1f8;
    local_1c8._8_4_ = 3;
    local_1b8 = (SyntaxNode *)0x0;
    _Stack_1b0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
    local_1c8._0_8_ = &PTR_getChild_006a50e8;
    sStack_1a0._M_extent._M_extent_value = _Var15._M_extent_value;
    sStack_1a0._M_ptr = local_1f8;
    openParen.info = local_208;
    openParen.kind = (undefined2)local_200;
    openParen._2_1_ = local_200._2_1_;
    openParen.numFlags.raw = local_200._3_1_;
    openParen.rawLen = local_200._4_4_;
    polarityOperator.info = TVar20.info;
    polarityOperator._0_8_ = local_258;
    _Stack_1b0._M_first._M_storage.info = (Info *)_Var15._M_extent_value;
    suffix = slang::syntax::SyntaxFactory::edgeSensitivePathSuffix
                       (&this->factory,openParen,
                        (SeparatedSyntaxList<slang::syntax::NameSyntax> *)local_1c8,polarityOperator
                        ,local_2d0,pEVar11,local_1d8);
    if (!bVar5 && 2 < _Var15._M_extent_value) {
      ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           (pTVar10 + 2));
      local_1c8 = (undefined1  [16])slang::syntax::SyntaxNode::getFirstToken(*ppSVar7);
      ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           (pTVar10 + (_Var15._M_extent_value - 1)));
      local_240._M_first._M_storage =
           (_Uninitialized<slang::parsing::Token,_true>)
           slang::syntax::SyntaxNode::getLastToken(*ppSVar7);
LAB_0044530a:
      SVar8 = Token::location((Token *)local_1c8);
      SVar9 = Token::location(&local_240._M_first._M_storage);
      sVar24 = Token::rawText(&local_240._M_first._M_storage);
      range.endLoc = (SourceLocation)((long)SVar9 + sVar24._M_len * 0x10000000);
      range.startLoc = SVar8;
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x820005,range);
    }
  }
  else {
    sStack_1a0 = parsePathTerminals(this);
    _Var15 = sStack_1a0._M_extent._M_extent_value;
    pTVar10 = sStack_1a0._M_ptr;
    local_1c8._8_4_ = 3;
    local_1b8 = (SyntaxNode *)0x0;
    _Stack_1b0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
    local_1c8._0_8_ = &PTR_getChild_006a50e8;
    _Stack_1b0._M_first._M_storage.info = (Info *)_Var15._M_extent_value;
    suffix = (EdgeSensitivePathSuffixSyntax *)
             slang::syntax::SyntaxFactory::simplePathSuffix
                       (&this->factory,(SeparatedSyntaxList<slang::syntax::NameSyntax> *)local_1c8);
    if (!bVar5 && 2 < _Var15._M_extent_value) {
      ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           (pTVar10 + 2));
      local_1c8 = (undefined1  [16])slang::syntax::SyntaxNode::getFirstToken(*ppSVar7);
      ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           (pTVar10 + (_Var15._M_extent_value - 1)));
      local_240._M_first._M_storage =
           (_Uninitialized<slang::parsing::Token,_true>)
           slang::syntax::SyntaxNode::getLastToken(*ppSVar7);
      goto LAB_0044530a;
    }
  }
  uVar2 = local_280;
  pIVar1 = local_2a8;
  pIVar16 = local_2c0;
  local_1e8 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  uVar3 = local_280;
  this_00 = (Info *)&this->factory;
  local_1c8._8_4_ = 3;
  local_1b8 = (SyntaxNode *)0x0;
  _Stack_1b0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
  _Stack_1b0._M_first._M_storage.info = (Info *)local_2a0._M_extent_value;
  local_1c8._0_8_ = &PTR_getChild_006a50e8;
  sStack_1a0._M_extent._M_extent_value = local_2a0._M_extent_value;
  sStack_1a0._M_ptr = local_288;
  edgeIdentifier.info = local_1f0;
  local_280._0_2_ = (undefined2)uVar2;
  local_280._2_1_ = SUB81(uVar2,2);
  local_280._3_1_ = SUB81(uVar2,3);
  local_280._4_4_ = SUB84(uVar2,4);
  edgeIdentifier.kind = (undefined2)local_280;
  edgeIdentifier._2_1_ = local_280._2_1_;
  edgeIdentifier.numFlags.raw = local_280._3_1_;
  edgeIdentifier.rawLen = local_280._4_4_;
  openParen_00.info = pIVar16;
  openParen_00._0_8_ = pIVar1;
  local_280 = uVar3;
  local_2a0._M_extent_value =
       (size_t)slang::syntax::SyntaxFactory::pathDescription
                         ((SyntaxFactory *)this_00,openParen_00,edgeIdentifier,
                          (SeparatedSyntaxList<slang::syntax::NameSyntax> *)local_1c8,local_278,
                          local_2b8,&suffix->super_PathSuffixSyntax,local_1e8);
  TVar19 = ParserBase::expect(&this->super_ParserBase,Equals);
  local_2a8 = TVar19.info;
  local_288 = TVar19._0_8_;
  Token::Token(&local_268);
  Token::Token(&local_250);
  Token::Token(&local_298);
  bVar5 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
  if (bVar5) {
    local_250 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
    if (((undefined1  [16])local_250 & (undefined1  [16])0x10000) == (undefined1  [16])0x0) {
      local_1c8._8_8_ = 0;
      local_1c8._0_8_ = &_Stack_1b0;
      local_1b8 = (SyntaxNode *)0x10;
      local_2d0 = ParserBase::peek(&this->super_ParserBase);
      bVar5 = slang::syntax::SyntaxFacts::isEndOfParenList(local_2d0.kind);
      if (bVar5) {
        bVar5 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
        if (!bVar5) {
          SVar8 = Token::location(&local_2d0);
          ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar8);
        }
        local_298 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
LAB_00445598:
        pIVar16 = local_298.info;
      }
      else {
        bVar5 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(local_2d0.kind);
        if (bVar5) {
          local_2c0 = this_00;
          do {
            pEVar11 = parseMinTypMaxExpression
                                (this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
            local_240._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar11;
            local_230 = CONCAT71(local_230._1_7_,1);
            SmallVectorBase<slang::syntax::TokenOrSyntax>::
            emplace_back<slang::syntax::TokenOrSyntax>
                      ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                       (TokenOrSyntax *)&local_240._M_first);
            TVar19 = ParserBase::peek(&this->super_ParserBase);
            TVar18 = TVar19.kind;
            bVar5 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar18);
            iVar6 = 3;
            pIVar16 = extraout_RDX_03;
            if (TVar18 != EndOfFile && !bVar5) {
              if (TVar18 != Comma) {
                ParserBase::expect(&this->super_ParserBase,Comma);
                do {
                  bVar5 = ParserBase::
                          skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                    (&this->super_ParserBase,(DiagCode)0x10001,false);
                  if (!bVar5) {
                    local_298 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
                    pIVar16 = local_298.info;
                    iVar6 = 1;
                    goto LAB_0044583a;
                  }
                  bVar5 = ParserBase::peek(&this->super_ParserBase,Comma);
                } while (!bVar5);
              }
              local_240._M_first._M_storage =
                   (_Uninitialized<slang::parsing::Token,_true>)
                   ParserBase::expect(&this->super_ParserBase,Comma);
              local_230 = local_230 & 0xffffffffffffff00;
              SmallVectorBase<slang::syntax::TokenOrSyntax>::
              emplace_back<slang::syntax::TokenOrSyntax>
                        ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                         (TokenOrSyntax *)&local_240._M_first);
              TVar19 = ParserBase::peek(&this->super_ParserBase);
              TVar18 = TVar19.kind;
              bVar5 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar18);
              if (TVar18 == EndOfFile || bVar5) {
                ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
                pIVar16 = extraout_RDX_05;
              }
              else {
                pIVar16 = extraout_RDX_04;
                if (((local_2d0.kind != TVar18) || (local_2d0.info != TVar19.info)) ||
                   (bVar5 = ParserBase::
                            skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                      (&this->super_ParserBase,(DiagCode)0x10001,true),
                   pIVar16 = extraout_RDX_06, bVar5)) {
                  iVar6 = 0;
                  local_2d0 = TVar19;
                }
              }
            }
LAB_0044583a:
            this_00 = local_2c0;
          } while (iVar6 == 0);
          if (iVar6 == 3) {
            local_298 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
            goto LAB_00445598;
          }
        }
        else {
          ParserBase::reportMissingList
                    (&this->super_ParserBase,local_2d0,CloseParenthesis,&local_298,(DiagCode)0x10001
                    );
          pIVar16 = extraout_RDX_09;
        }
      }
      iVar6 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                        ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                         (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar16);
      lVar12 = CONCAT44(extraout_var_00,iVar6);
      uVar17 = extraout_RDX_10;
      if ((_Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
          local_1c8._0_8_ != &_Stack_1b0) {
        operator_delete((void *)local_1c8._0_8_);
      }
    }
    else {
      SVar8 = Token::location(&local_250);
      local_298 = ParserBase::missingToken(&this->super_ParserBase,CloseParenthesis,SVar8);
      lVar12 = 0;
      uVar17 = 0;
    }
    local_268 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    goto LAB_0044592a;
  }
  local_1c8._8_8_ = 0;
  local_1c8._0_8_ = &_Stack_1b0;
  local_1b8 = (SyntaxNode *)0x4;
  local_2d0 = ParserBase::peek(&this->super_ParserBase);
  bVar5 = slang::syntax::SyntaxFacts::isSemicolon(local_2d0.kind);
  if (bVar5) {
    bVar5 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar5) {
      SVar8 = Token::location(&local_2d0);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar8);
    }
    local_268 = ParserBase::expect(&this->super_ParserBase,Semicolon);
LAB_00445512:
    pIVar16 = local_268.info;
  }
  else {
    bVar5 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(local_2d0.kind);
    if (bVar5) {
      local_2c0 = this_00;
      do {
        pEVar11 = parseMinTypMaxExpression
                            (this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
        local_240._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar11;
        local_230 = CONCAT71(local_230._1_7_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                   (TokenOrSyntax *)&local_240._M_first);
        TVar19 = ParserBase::peek(&this->super_ParserBase);
        bVar5 = slang::syntax::SyntaxFacts::isSemicolon(TVar19.kind);
        iVar6 = 3;
        pIVar16 = extraout_RDX;
        if (TVar19.kind == Comma && !bVar5) {
          local_240._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,Comma);
          local_230 = local_230 & 0xffffffffffffff00;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (TokenOrSyntax *)&local_240._M_first);
          TVar19 = ParserBase::peek(&this->super_ParserBase);
          TVar18 = TVar19.kind;
          bVar5 = slang::syntax::SyntaxFacts::isSemicolon(TVar18);
          if (TVar18 == EndOfFile || bVar5) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            pIVar16 = extraout_RDX_01;
          }
          else {
            pIVar16 = extraout_RDX_00;
            if (((local_2d0.kind != TVar18) || (local_2d0.info != TVar19.info)) ||
               (bVar5 = ParserBase::
                        skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isSemicolon>
                                  (&this->super_ParserBase,(DiagCode)0x10001,true),
               pIVar16 = extraout_RDX_02, bVar5)) {
              iVar6 = 0;
              local_2d0 = TVar19;
            }
          }
        }
        this_00 = local_2c0;
      } while (iVar6 == 0);
      if (iVar6 == 3) {
        local_268 = ParserBase::expect(&this->super_ParserBase,Semicolon);
        goto LAB_00445512;
      }
    }
    else {
      ParserBase::reportMissingList
                (&this->super_ParserBase,local_2d0,Semicolon,&local_268,(DiagCode)0x10001);
      pIVar16 = extraout_RDX_07;
    }
  }
  iVar6 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar16);
  lVar12 = CONCAT44(extraout_var,iVar6);
  uVar17 = extraout_RDX_08;
  if ((_Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)local_1c8._0_8_
      != &_Stack_1b0) {
    operator_delete((void *)local_1c8._0_8_);
  }
LAB_0044592a:
  if ((0x17 < uVar17) || ((0x80082bUL >> (uVar17 & 0x3f) & 1) == 0)) {
    __v = (variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
          (lVar12 + (uVar17 - 1) * 0x18);
    if (*(char *)(lVar12 + (uVar17 - 1) * 0x18 + 0x10) == '\x01') {
      ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(__v);
      SVar25 = slang::syntax::SyntaxNode::sourceRange(*ppSVar7);
    }
    else {
      pvVar14 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(__v);
      local_1c8 = *(undefined1 (*) [16])pvVar14;
      SVar25 = Token::range((Token *)local_1c8);
    }
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xbf0005,SVar25);
  }
  local_1c8._8_4_ = 1;
  local_1b8 = (SyntaxNode *)0x0;
  _Stack_1b0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
  _Stack_1b0._M_first._M_storage.info = (Info *)0x0;
  sStack_1a0 = (span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>)ZEXT816(0);
  local_1c8._0_8_ = &PTR_getChild_006a4d30;
  local_240._8_4_ = 3;
  local_230 = 0;
  uStack_228 = 0;
  local_240._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_006a53b8;
  equals.info = local_2a8;
  equals._0_8_ = local_288;
  local_220 = uVar17;
  local_218 = lVar12;
  local_210 = uVar17;
  pPVar13 = slang::syntax::SyntaxFactory::pathDeclaration
                      ((SyntaxFactory *)this_00,
                       (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_1c8,
                       (PathDescriptionSyntax *)local_2a0._M_extent_value,equals,local_250,
                       (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)&local_240._M_first,
                       local_298,local_268);
  return pPVar13;
}

Assistant:

PathDeclarationSyntax& Parser::parsePathDeclaration() {
    auto parsePolarity = [&] {
        switch (peek().kind) {
            case TokenKind::Plus:
            case TokenKind::Minus:
                return consume();
            default:
                return Token();
        }
    };

    auto checkTerminals = [&](std::span<TokenOrSyntax> terminals, bool isFull) {
        if (!isFull && terminals.size() > 2) {
            Token first = terminals[2].node()->getFirstToken();
            Token last = terminals.back().node()->getLastToken();
            addDiag(diag::MultipleParallelTerminals,
                    SourceRange{first.location(), last.location() + last.rawText().length()});
        }
    };

    auto openParen = expect(TokenKind::OpenParenthesis);
    auto edge = parseEdgeKeyword();
    auto inputs = parsePathTerminals();
    auto polarity = parsePolarity();

    // In specify blocks, +=> (and -=>) should be parsed as '+' and '=>',
    // but of course the lexer tokenizes it as '+=' and '>' so we need to
    // work around that here.
    Token op;
    bool isFull = false;
    if (!polarity && (peek(TokenKind::PlusEqual) || peek(TokenKind::MinusEqual))) {
        polarity = consume();
        op = consumeIf(TokenKind::GreaterThan);
        if (!op) {
            addDiag(diag::ExpectedPathOp, polarity.location() + 1);
            op = missingToken(TokenKind::GreaterThan, peek().location());
        }
        else if (!op.trivia().empty()) {
            addDiag(diag::ExpectedPathOp, polarity.location() + 1);
        }
    }
    else {
        switch (peek().kind) {
            case TokenKind::StarArrow:
                isFull = true;
                op = consume();
                break;
            case TokenKind::EqualsArrow:
                op = consume();
                break;
            default:
                addDiag(diag::ExpectedPathOp, peek().location());
                op = missingToken(TokenKind::EqualsArrow, peek().location());
                break;
        }
    }

    checkTerminals(inputs, isFull);

    PathSuffixSyntax* suffix;
    if (peek(TokenKind::OpenParenthesis)) {
        auto suffixOpenParen = consume();
        auto outputs = parsePathTerminals();
        auto polarity2 = parsePolarity();

        // The polarity we just tried to parse could have been a '+' or a '-' next
        // to the expected colon, which would get lexed together as a single token.
        // In that case don't bother trying to find another colon token.
        Token colon;
        if (!polarity2 && (peek(TokenKind::PlusColon) || peek(TokenKind::MinusColon)))
            polarity2 = consume();
        else
            colon = expect(TokenKind::Colon);

        auto& expr = parseExpression();
        auto suffixCloseParen = expect(TokenKind::CloseParenthesis);
        suffix = &factory.edgeSensitivePathSuffix(suffixOpenParen, outputs, polarity2, colon, expr,
                                                  suffixCloseParen);

        checkTerminals(outputs, isFull);
    }
    else {
        auto outputs = parsePathTerminals();
        suffix = &factory.simplePathSuffix(outputs);
        checkTerminals(outputs, isFull);
    }

    auto closeParen = expect(TokenKind::CloseParenthesis);
    auto& desc = factory.pathDescription(openParen, edge, inputs, polarity, op, *suffix,
                                         closeParen);

    auto equals = expect(TokenKind::Equals);

    Token semi;
    Token valueOpenParen, valueCloseParen;
    std::span<TokenOrSyntax> delays;

    if (peek(TokenKind::OpenParenthesis)) {
        parseList<isPossibleExpressionOrComma, isEndOfParenList>(
            TokenKind::OpenParenthesis, TokenKind::CloseParenthesis, TokenKind::Comma,
            valueOpenParen, delays, valueCloseParen, RequireItems::True, diag::ExpectedExpression,
            [this] { return &parseMinTypMaxExpression(); });
        semi = expect(TokenKind::Semicolon);
    }
    else {
        SmallVector<TokenOrSyntax, 4> buffer;
        parseList<isPossibleExpressionOrComma, isSemicolon>(
            buffer, TokenKind::Semicolon, TokenKind::Comma, semi, RequireItems::True,
            diag::ExpectedExpression, [this] { return &parseMinTypMaxExpression(); });
        delays = buffer.copy(alloc);
    }

    if (delays.size() > 0 && delays.size() != 1 && delays.size() != 3 && delays.size() != 5 &&
        delays.size() != 11 && delays.size() != 23) {
        auto& lastDelay = delays.back();
        auto range = lastDelay.isNode() ? lastDelay.node()->sourceRange()
                                        : lastDelay.token().range();
        addDiag(diag::WrongSpecifyDelayCount, range);
    }

    return factory.pathDeclaration(nullptr, desc, equals, valueOpenParen, delays, valueCloseParen,
                                   semi);
}